

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFS.h
# Opt level: O2

bool dg::pta::PointerAnalysisFS::pointsToAllocationInLoop(PSNode *n)

{
  bool bVar1;
  bool bVar2;
  PSNode *n_00;
  Pointer PVar3;
  const_iterator __begin2;
  const_iterator local_40;
  
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::begin(&local_40,
          (SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
           *)(n + 0xb0));
  while( true ) {
    bVar1 = local_40.container_it.
            super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
            != (__node_type *)0x0 || local_40.pos != 0;
    if (local_40.container_it.
        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur ==
        (__node_type *)0x0 && local_40.pos == 0) {
      return bVar1;
    }
    PVar3 = PointerIdPointsToSet::const_iterator::operator*((const_iterator *)&local_40);
    n_00 = PVar3.target;
    if ((((n_00 != NULLPTR) && (n_00 != UNKNOWN_MEMORY)) && (n_00 != INVALIDATED)) &&
       (bVar2 = isOnLoop(n_00), bVar2)) break;
    ADT::
    SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
    ::const_iterator::operator++(&local_40);
  }
  return bVar1;
}

Assistant:

static bool pointsToAllocationInLoop(PSNode *n) {
        for (const auto &ptr : n->pointsTo) {
            // skip invalidated, null and unknown memory
            if (!ptr.isValid() || ptr.isInvalidated())
                continue;

            if (isOnLoop(ptr.target))
                return true;
        }
        return false;
    }